

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
::lexer(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
        *this,input_stream_adapter *adapter,bool ignore_comments_)

{
  char cVar1;
  int_type iVar2;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  input_stream_adapter *in_RDI;
  
  input_stream_adapter::input_stream_adapter(in_RDI,(input_stream_adapter *)in_RSI);
  *(byte *)&in_RDI[1].is = in_DL & 1;
  iVar2 = CLI::std::char_traits<char>::eof();
  *(int_type *)((long)&in_RDI[1].is + 4) = iVar2;
  *(undefined1 *)&in_RDI[1].sb = 0;
  in_RDI[2].is = (istream *)0x0;
  in_RDI[2].sb = (streambuf *)0x0;
  in_RDI[3].is = (istream *)0x0;
  memset(&in_RDI[3].sb,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x66394f);
  std::__cxx11::string::string(in_RSI);
  in_RDI[7].is = (istream *)0x81eebc;
  in_RDI[7].sb = (streambuf *)0x0;
  in_RDI[8].is = (istream *)0x0;
  in_RDI[8].sb = (streambuf *)0x0;
  cVar1 = get_decimal_point();
  *(int *)&in_RDI[9].is = (int)cVar1;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter, bool ignore_comments_ = false) noexcept
        : ia(std::move(adapter))
        , ignore_comments(ignore_comments_)
        , decimal_point_char(static_cast<char_int_type>(get_decimal_point()))
    {}